

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O1

attr_list INT_EVdfg_get_attr_list(EVdfg_stone stone)

{
  EVdfg_configuration p_Var1;
  EVdfg p_Var2;
  long lVar3;
  EVdfg_stone_state p_Var4;
  EVdfg p_Var5;
  long lVar6;
  
  p_Var2 = stone->dfg;
  p_Var1 = p_Var2->deployed_state;
  if (p_Var1 != (EVdfg_configuration)0x0) {
    p_Var2 = (EVdfg)(long)p_Var1->stone_count;
    if (0 < (long)p_Var2) {
      p_Var5 = (EVdfg)0x0;
      do {
        p_Var4 = p_Var1->stones[(long)p_Var5];
        if (p_Var4->stone_id == stone->stone_id) goto LAB_00141ae6;
        p_Var5 = (EVdfg)((long)&p_Var5->client + 1);
      } while (p_Var2 != p_Var5);
    }
    p_Var4 = (EVdfg_stone_state)0x0;
LAB_00141ae6:
    if (p_Var4 != (EVdfg_stone_state)0x0) {
      if (p_Var4->attrs != (attr_list)0x0) {
        add_ref_attr_list();
      }
      p_Var2 = (EVdfg)p_Var4->attrs;
    }
    if (p_Var4 != (EVdfg_stone_state)0x0) {
      return (attr_list)p_Var2;
    }
  }
  if (stone->dfg->working_state != (EVdfg_configuration)0x0) {
    p_Var1 = stone->dfg->deployed_state;
    lVar3 = (long)p_Var1->stone_count;
    if (0 < lVar3) {
      lVar6 = 0;
      do {
        p_Var4 = p_Var1->stones[lVar6];
        if (p_Var4->stone_id == stone->stone_id) goto LAB_00141b38;
        lVar6 = lVar6 + 1;
      } while (lVar3 != lVar6);
    }
    p_Var4 = (EVdfg_stone_state)0x0;
LAB_00141b38:
    if (p_Var4 != (EVdfg_stone_state)0x0) {
      if (p_Var4->attrs != (attr_list)0x0) {
        add_ref_attr_list();
      }
      p_Var2 = (EVdfg)p_Var4->attrs;
    }
    if (p_Var4 != (EVdfg_stone_state)0x0) {
      return (attr_list)p_Var2;
    }
  }
  return (attr_list)0x0;
}

Assistant:

extern attr_list
INT_EVdfg_get_attr_list(EVdfg_stone stone)
{
    if (stone->dfg->deployed_state) {
	EVdfg_stone_state dstone = find_stone_state(stone->stone_id, stone->dfg->deployed_state);
	if (dstone) {
	    if (dstone->attrs) add_ref_attr_list(dstone->attrs);
	    return dstone->attrs;
	}
    }
    if (stone->dfg->working_state) {
	EVdfg_stone_state wstone = find_stone_state(stone->stone_id, stone->dfg->deployed_state);
	if (wstone) {
	    if (wstone->attrs) add_ref_attr_list(wstone->attrs);
	    return wstone->attrs;
	}
    }	
    return NULL;
}